

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,UChar *buff,int32_t buffLength,int32_t buffCapacity)

{
  bool bVar1;
  UChar *limit;
  UChar *p;
  int32_t local_1c;
  int32_t buffCapacity_local;
  int32_t buffLength_local;
  UChar *buff_local;
  UnicodeString *this_local;
  
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_004a9298
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if (buff == (UChar *)0x0) {
    setToEmpty(this);
  }
  else if (((buffLength < -1) || (buffCapacity < 0)) || (buffCapacity < buffLength)) {
    setToBogus(this);
  }
  else {
    local_1c = buffLength;
    if (buffLength == -1) {
      limit = buff;
      while( true ) {
        bVar1 = false;
        if (limit != buff + buffCapacity) {
          bVar1 = *limit != L'\0';
        }
        if (!bVar1) break;
        limit = limit + 1;
      }
      local_1c = (int32_t)((long)limit - (long)buff >> 1);
    }
    setArray(this,buff,local_1c,buffCapacity);
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UChar *buff,
                             int32_t buffLength,
                             int32_t buffCapacity) {
  fUnion.fFields.fLengthAndFlags = kWritableAlias;
  if(buff == NULL) {
    // treat as an empty string, do not alias
    setToEmpty();
  } else if(buffLength < -1 || buffCapacity < 0 || buffLength > buffCapacity) {
    setToBogus();
  } else {
    if(buffLength == -1) {
      // fLength = u_strlen(buff); but do not look beyond buffCapacity
      const UChar *p = buff, *limit = buff + buffCapacity;
      while(p != limit && *p != 0) {
        ++p;
      }
      buffLength = (int32_t)(p - buff);
    }
    setArray(buff, buffLength, buffCapacity);
  }
}